

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

size_t __thiscall
brotli::HashToBinaryTree::FindAllMatches
          (HashToBinaryTree *this,uint8_t *data,size_t ring_buffer_mask,size_t cur_ix,
          size_t max_length,size_t max_backward,BackwardMatch *matches)

{
  uint8_t *puVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  BackwardMatch *matches_00;
  uint32_t *matches_01;
  size_t l;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint8_t *puVar12;
  size_t best_len;
  size_t local_78;
  ulong local_70;
  size_t local_68;
  ulong local_60;
  size_t local_58;
  uint8_t *local_50;
  ulong local_48;
  ulong local_40;
  HashToBinaryTree *local_38;
  
  local_60 = cur_ix & ring_buffer_mask;
  uVar5 = 0;
  if (0x3f < cur_ix) {
    uVar5 = cur_ix - 0x40;
  }
  local_78 = 1;
  uVar9 = cur_ix - 1;
  matches_00 = matches;
  if (uVar5 < uVar9) {
    puVar1 = data + local_60;
    local_40 = max_length >> 3;
    local_48 = max_length & 0xfffffffffffffff8;
    local_50 = puVar1 + local_48;
    local_70 = (ulong)((uint)max_length & 7);
    do {
      if (max_backward < cur_ix - uVar9) {
        bVar3 = true;
      }
      else {
        uVar6 = uVar9 & ring_buffer_mask;
        bVar3 = false;
        if ((*puVar1 == data[uVar6]) && (puVar1[1] == data[uVar6 + 1])) {
          if (7 < max_length) {
            lVar11 = 0;
            uVar7 = 0;
LAB_00169a57:
            if (*(ulong *)(puVar1 + uVar7 * 8) == *(ulong *)(data + uVar7 * 8 + uVar6))
            goto code_r0x00169a64;
            uVar7 = *(ulong *)(data + uVar7 * 8 + uVar6) ^ *(ulong *)(puVar1 + uVar7 * 8);
            uVar6 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
              }
            }
            uVar7 = (uVar6 >> 3 & 0x1fffffff) - lVar11;
            goto LAB_00169aa2;
          }
          uVar10 = 0;
          puVar12 = puVar1;
LAB_00169ae9:
          uVar7 = uVar10;
          if (local_70 != 0) {
            uVar4 = uVar10 | local_70;
            uVar8 = local_70;
            do {
              uVar7 = uVar10;
              local_68 = max_backward;
              if (data[uVar10 + uVar6] != *puVar12) break;
              puVar12 = puVar12 + 1;
              uVar10 = uVar10 + 1;
              uVar8 = uVar8 - 1;
              uVar7 = uVar4;
            } while (uVar8 != 0);
          }
LAB_00169aa2:
          bVar3 = false;
          if (local_78 < uVar7) {
            *matches_00 = (BackwardMatch)(cur_ix - uVar9 & 0xffffffff | uVar7 << 0x25);
            matches_00 = matches_00 + 1;
            local_78 = uVar7;
          }
        }
      }
      local_58 = ring_buffer_mask;
    } while (((!bVar3) && (uVar9 = uVar9 - 1, uVar5 < uVar9)) && (local_78 < 3));
  }
  local_38 = this;
  if (local_78 < max_length) {
    matches_00 = StoreAndFindMatches(this,data,cur_ix,ring_buffer_mask,max_length,&local_78,
                                     matches_00);
  }
  matches_01 = (uint32_t *)operator_new(0x98);
  lVar11 = 0;
  do {
    *(undefined4 *)((long)matches_01 + lVar11) = 0xfffffff;
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x98);
  uVar5 = 4;
  if (4 < local_78 + 1) {
    uVar5 = local_78 + 1;
  }
  bVar3 = FindAllStaticDictionaryMatches(data + local_60,uVar5,max_length,matches_01);
  if (bVar3) {
    uVar9 = 0x25;
    if (max_length < 0x25) {
      uVar9 = max_length;
    }
    if (uVar5 <= uVar9) {
      lVar11 = uVar5 << 0x25;
      do {
        uVar2 = matches_01[uVar5];
        if (uVar2 < 0xfffffff) {
          uVar6 = (ulong)(uVar2 & 0x1f) << 0x20;
          if (uVar5 == (uVar2 & 0x1f)) {
            uVar6 = 0;
          }
          *matches_00 = (BackwardMatch)(((uVar2 >> 5) + (int)max_backward + 1 | uVar6) + lVar11);
          matches_00 = matches_00 + 1;
        }
        uVar5 = uVar5 + 1;
        lVar11 = lVar11 + 0x2000000000;
      } while (uVar9 + 1 != uVar5);
    }
  }
  operator_delete(matches_01,0x98);
  return (long)matches_00 - (long)matches >> 3;
code_r0x00169a64:
  uVar7 = uVar7 + 1;
  lVar11 = lVar11 + -8;
  uVar10 = local_48;
  puVar12 = local_50;
  if (local_40 == uVar7) goto LAB_00169ae9;
  goto LAB_00169a57;
}

Assistant:

size_t FindAllMatches(const uint8_t* data,
                        const size_t ring_buffer_mask,
                        const size_t cur_ix,
                        const size_t max_length,
                        const size_t max_backward,
                        BackwardMatch* matches) {
    BackwardMatch* const orig_matches = matches;
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    size_t best_len = 1;
    size_t stop = cur_ix - 64;
    if (cur_ix < 64) { stop = 0; }
    for (size_t i = cur_ix - 1; i > stop && best_len <= 2; --i) {
      size_t prev_ix = i;
      const size_t backward = cur_ix - prev_ix;
      if (PREDICT_FALSE(backward > max_backward)) {
        break;
      }
      prev_ix &= ring_buffer_mask;
      if (data[cur_ix_masked] != data[prev_ix] ||
          data[cur_ix_masked + 1] != data[prev_ix + 1]) {
        continue;
      }
      const size_t len =
          FindMatchLengthWithLimit(&data[prev_ix], &data[cur_ix_masked],
                                   max_length);
      if (len > best_len) {
        best_len = len;
        *matches++ = BackwardMatch(backward, len);
      }
    }
    if (best_len < max_length) {
      matches = StoreAndFindMatches(data, cur_ix, ring_buffer_mask,
                                    max_length, &best_len, matches);
    }
    std::vector<uint32_t> dict_matches(kMaxDictionaryMatchLen + 1,
                                       kInvalidMatch);
    size_t minlen = std::max<size_t>(4, best_len + 1);
    if (FindAllStaticDictionaryMatches(&data[cur_ix_masked], minlen, max_length,
                                       &dict_matches[0])) {
      size_t maxlen = std::min<size_t>(kMaxDictionaryMatchLen, max_length);
      for (size_t l = minlen; l <= maxlen; ++l) {
        uint32_t dict_id = dict_matches[l];
        if (dict_id < kInvalidMatch) {
          *matches++ = BackwardMatch(max_backward + (dict_id >> 5) + 1, l,
                                     dict_id & 31);
        }
      }
    }
    return static_cast<size_t>(matches - orig_matches);
  }